

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_FastInst.hpp
# Opt level: O0

bool __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::InstMatcher::matchNextAux
          (InstMatcher *this,TermList queryTerm,TermList nodeTerm,bool separate)

{
  pair<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::InstMatcher::TermSpec,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::InstMatcher::TermSpec>
  elem;
  pair<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::InstMatcher::TermSpec,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::InstMatcher::TermSpec>
  elem_00;
  bool bVar1;
  int iVar2;
  InstMatcher *pIVar3;
  pair<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::InstMatcher::TermSpec,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::InstMatcher::TermSpec>
  *ppVar4;
  byte in_CL;
  uint64_t in_RDX;
  uint64_t in_RSI;
  undefined8 in_RDI;
  TermSpec TVar5;
  TermSpec deref2;
  TermSpec deref1;
  bool dt2Bindable;
  bool dt1Bindable;
  TermList dt2;
  TermList dt1;
  pair<Kernel::TermList,_Kernel::TermList> disarg;
  TermSpec ts2;
  TermSpec ts1;
  bool success;
  TermSpec tsNode;
  TermSpec tsBinding;
  uint specVar;
  InstMatcher *in_stack_fffffffffffffd58;
  TermList in_stack_fffffffffffffd60;
  TermList var;
  size_t in_stack_fffffffffffffd68;
  InstMatcher *in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd78;
  byte in_stack_fffffffffffffd7c;
  undefined1 in_stack_fffffffffffffd7d;
  byte bVar6;
  byte in_stack_fffffffffffffd7e;
  undefined1 in_stack_fffffffffffffd7f;
  byte bVar7;
  TermList in_stack_fffffffffffffd80;
  undefined7 uVar8;
  undefined1 disjunctVariables;
  InstMatcher *in_stack_fffffffffffffd90;
  TermList in_stack_fffffffffffffd98;
  TermList in_stack_fffffffffffffda0;
  undefined8 local_258;
  undefined7 uStack_247;
  undefined7 uStack_22f;
  TermSpec local_218;
  uint64_t local_208;
  TermSpec local_200;
  uint64_t local_1f0;
  TermSpec local_1e8;
  uint64_t local_1d8;
  uint64_t local_1d0;
  uint64_t local_1c8;
  TermSpec local_1c0;
  uint64_t local_1b0;
  uint64_t local_1a8;
  uint64_t local_1a0;
  TermSpec local_198;
  uint64_t local_188;
  uint64_t local_180;
  uint64_t local_178;
  TermSpec local_170;
  uint64_t local_160;
  uint64_t local_158;
  byte local_14a;
  byte local_149;
  TermList local_148;
  TermList local_140;
  pair<Kernel::TermList,_Kernel::TermList> local_138;
  uint64_t local_128;
  uint64_t local_120;
  pair<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::InstMatcher::TermSpec,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::InstMatcher::TermSpec>
  local_118;
  ulong local_f8;
  uint64_t local_f0;
  ulong local_e8;
  uint64_t local_e0;
  InstMatcher *local_d8;
  DisagreementSetIterator *local_d0;
  undefined8 local_c0;
  bool local_a1;
  ulong local_a0;
  uint64_t local_98;
  uint64_t local_90;
  uint64_t local_88;
  uint64_t local_80;
  TermSpec local_78;
  ulong local_68;
  uint64_t local_60;
  int local_58;
  uint64_t local_50;
  TermSpec local_48;
  ulong local_38;
  uint64_t local_30;
  uint local_28;
  byte local_21;
  TermList local_18;
  TermList local_10 [2];
  
  local_21 = in_CL & 1;
  uVar8 = (undefined7)in_RDI;
  disjunctVariables = (undefined1)((ulong)in_RDI >> 0x38);
  local_18._content = in_RDX;
  local_10[0]._content = in_RSI;
  TermSpec::TermSpec((TermSpec *)0x41bb54);
  local_50 = local_18._content;
  TermSpec::TermSpec(&local_48,false,local_18);
  bVar1 = Kernel::TermList::isSpecialVar((TermList *)0x41bb88);
  if (bVar1) {
    local_28 = Kernel::TermList::var(local_10);
    bVar1 = findSpecVarBinding(in_stack_fffffffffffffd70,(uint)(in_stack_fffffffffffffd68 >> 0x20),
                               (TermSpec *)in_stack_fffffffffffffd60._content);
    if (!bVar1) {
      Kernel::TermList::TermList
                ((TermList *)in_stack_fffffffffffffd60._content,
                 (uint)((ulong)in_stack_fffffffffffffd58 >> 0x20),
                 SUB81((ulong)in_stack_fffffffffffffd58 >> 0x18,0));
      local_68 = local_48._0_8_;
      local_60 = local_48.t._content;
      bind((InstMatcher *)CONCAT17(disjunctVariables,uVar8),local_58,
           (sockaddr *)(local_48._0_8_ & 0xff),(socklen_t)local_48.t._content);
      return true;
    }
  }
  else {
    local_80 = local_10[0]._content;
    TermSpec::TermSpec(&local_78,true,local_10[0]);
    local_38 = local_78._0_8_;
    local_30 = local_78.t._content;
  }
  if (((local_38 & 1) != 0) &&
     (bVar1 = Kernel::TermList::isOrdinaryVar((TermList *)0x41bc97), bVar1)) {
    local_88 = local_30;
    bVar1 = isBound(in_stack_fffffffffffffd58,in_stack_fffffffffffffd60);
    if (!bVar1) {
      local_90 = local_30;
      local_a0 = local_48._0_8_;
      local_98 = local_48.t._content;
      bind((InstMatcher *)CONCAT17(disjunctVariables,uVar8),(int)local_30,
           (sockaddr *)(local_48._0_8_ & 0xff),(socklen_t)local_48.t._content);
      return true;
    }
  }
  bVar1 = Kernel::TermList::isTerm((TermList *)0x41bd34);
  if (bVar1) {
    Kernel::TermList::term((TermList *)0x41bd4a);
    bVar1 = Kernel::Term::shared((Term *)0x41bd52);
    if (bVar1) {
      Kernel::TermList::term((TermList *)0x41bd68);
      bVar1 = Kernel::Term::ground((Term *)0x41bd70);
      if (((bVar1) && ((local_38 & 1) != 0)) &&
         (bVar1 = Kernel::TermList::isTerm((TermList *)0x41bd91), bVar1)) {
        Kernel::TermList::term((TermList *)0x41bda8);
        bVar1 = Kernel::Term::ground((Term *)0x41bdb0);
        if (bVar1) {
          in_stack_fffffffffffffd80._content =
               (uint64_t)Kernel::TermList::term((TermList *)0x41bdc3);
          pIVar3 = (InstMatcher *)Kernel::TermList::term((TermList *)0x41bdd9);
          local_a1 = (InstMatcher *)in_stack_fffffffffffffd80._content == pIVar3;
          goto LAB_0041c52d;
        }
      }
    }
  }
  if ((matchNextAux(Kernel::TermList,Kernel::TermList,bool)::toDo == '\0') &&
     (iVar2 = __cxa_guard_acquire(&matchNextAux(Kernel::TermList,Kernel::TermList,bool)::toDo),
     iVar2 != 0)) {
    Lib::
    Stack<std::pair<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::InstMatcher::TermSpec,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::InstMatcher::TermSpec>_>
    ::Stack((Stack<std::pair<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::InstMatcher::TermSpec,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::InstMatcher::TermSpec>_>
             *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
    __cxa_atexit(Lib::
                 Stack<std::pair<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::InstMatcher::TermSpec,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::InstMatcher::TermSpec>_>
                 ::~Stack,&matchNextAux::toDo,&__dso_handle);
    __cxa_guard_release(&matchNextAux(Kernel::TermList,Kernel::TermList,bool)::toDo);
  }
  if ((matchNextAux(Kernel::TermList,Kernel::TermList,bool)::dsit == '\0') &&
     (iVar2 = __cxa_guard_acquire(&matchNextAux(Kernel::TermList,Kernel::TermList,bool)::dsit),
     iVar2 != 0)) {
    Kernel::DisagreementSetIterator::DisagreementSetIterator
              ((DisagreementSetIterator *)in_stack_fffffffffffffd80._content);
    __cxa_atexit(Kernel::DisagreementSetIterator::~DisagreementSetIterator,&matchNextAux::dsit,
                 &__dso_handle);
    __cxa_guard_release(&matchNextAux(Kernel::TermList,Kernel::TermList,bool)::dsit);
  }
  Lib::
  Stack<std::pair<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::InstMatcher::TermSpec,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::InstMatcher::TermSpec>_>
  ::reset(&matchNextAux::toDo);
  std::
  make_pair<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::InstMatcher::TermSpec&,Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::InstMatcher::TermSpec&>
            ((TermSpec *)in_stack_fffffffffffffd60._content,(TermSpec *)in_stack_fffffffffffffd58);
  elem.first.t._content._0_4_ = in_stack_fffffffffffffd78;
  elem.first._0_8_ = local_c0;
  elem.first.t._content._4_1_ = in_stack_fffffffffffffd7c;
  elem.first.t._content._5_1_ = in_stack_fffffffffffffd7d;
  elem.first.t._content._6_1_ = in_stack_fffffffffffffd7e;
  elem.first.t._content._7_1_ = in_stack_fffffffffffffd7f;
  elem.second._0_8_ = in_stack_fffffffffffffd80._content;
  elem.second.t._content._0_7_ = uVar8;
  elem.second.t._content._7_1_ = disjunctVariables;
  Lib::
  Stack<std::pair<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::InstMatcher::TermSpec,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::InstMatcher::TermSpec>_>
  ::push((Stack<std::pair<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::InstMatcher::TermSpec,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::InstMatcher::TermSpec>_>
          *)local_d0,elem);
  pIVar3 = local_d8;
  var._content = (uint64_t)local_d0;
LAB_0041bef4:
  bVar1 = Lib::
          Stack<std::pair<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::InstMatcher::TermSpec,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::InstMatcher::TermSpec>_>
          ::isNonEmpty(&matchNextAux::toDo);
  if (bVar1) {
    ppVar4 = Lib::
             Stack<std::pair<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::InstMatcher::TermSpec,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::InstMatcher::TermSpec>_>
             ::top(&matchNextAux::toDo);
    local_e8 = *(ulong *)&ppVar4->first;
    local_e0 = (ppVar4->first).t._content;
    Lib::
    Stack<std::pair<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::InstMatcher::TermSpec,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::InstMatcher::TermSpec>_>
    ::pop(&local_118,&matchNextAux::toDo);
    local_f8 = local_118.second._0_8_;
    local_f0 = local_118.second.t._content;
    local_120 = local_e0;
    local_128 = local_118.second.t._content;
    Kernel::DisagreementSetIterator::reset
              ((DisagreementSetIterator *)in_stack_fffffffffffffd90,in_stack_fffffffffffffda0,
               in_stack_fffffffffffffd98,(bool)disjunctVariables);
LAB_0041bfc0:
    do {
      bVar1 = Kernel::DisagreementSetIterator::hasNext
                        ((DisagreementSetIterator *)in_stack_fffffffffffffd98._content);
      if (!bVar1) goto LAB_0041bef4;
      local_138 = Kernel::DisagreementSetIterator::next((DisagreementSetIterator *)var._content);
      local_140._content = local_138.first._content;
      local_148._content = local_138.second._content;
      bVar1 = Kernel::TermList::isTerm((TermList *)0x41c01e);
      bVar7 = 0;
      if ((!bVar1) &&
         (in_stack_fffffffffffffd7e = 1, bVar7 = in_stack_fffffffffffffd7e, (local_e8 & 1) == 0)) {
        bVar1 = Kernel::TermList::isOrdinaryVar((TermList *)0x41c048);
        in_stack_fffffffffffffd7e = bVar1 ^ 0xff;
        bVar7 = in_stack_fffffffffffffd7e;
      }
      local_149 = bVar7 & 1;
      bVar1 = Kernel::TermList::isTerm((TermList *)0x41c070);
      bVar6 = 0;
      if ((!bVar1) &&
         (in_stack_fffffffffffffd7c = 1, bVar6 = in_stack_fffffffffffffd7c, (local_f8 & 1) == 0)) {
        bVar1 = Kernel::TermList::isOrdinaryVar((TermList *)0x41c09a);
        in_stack_fffffffffffffd7c = bVar1 ^ 0xff;
        bVar6 = in_stack_fffffffffffffd7c;
      }
      local_14a = bVar6 & 1;
      if (((local_149 & 1) == 0) && (local_14a == 0)) {
        local_a1 = false;
        goto LAB_0041c52d;
      }
      if (((local_e8 & 1) == 0) ||
         (bVar1 = Kernel::TermList::isOrdinaryVar((TermList *)0x41c13b), !bVar1)) {
LAB_0041c1d4:
        if (((local_f8 & 1) != 0) &&
           (bVar1 = Kernel::TermList::isOrdinaryVar((TermList *)0x41c1ef), bVar1)) {
          local_180 = local_148._content;
          bVar1 = isBound(pIVar3,var);
          if (!bVar1) {
            local_188 = local_148._content;
            local_1a0 = local_140._content;
            TermSpec::TermSpec(&local_198,(bool)((byte)local_e8 & 1),local_140);
            bind((InstMatcher *)CONCAT17(disjunctVariables,uVar8),(int)local_188,
                 (sockaddr *)(ulong)local_198.q,(socklen_t)local_198.t._content);
            goto LAB_0041bfc0;
          }
        }
        bVar1 = Kernel::TermList::isSpecialVar((TermList *)0x41c295);
        if (bVar1) {
          local_1a8 = local_148._content;
          bVar1 = isBound(pIVar3,var);
          if (!bVar1) {
            local_1b0 = local_148._content;
            local_1c8 = local_140._content;
            TermSpec::TermSpec(&local_1c0,(bool)((byte)local_e8 & 1),local_140);
            bind((InstMatcher *)CONCAT17(disjunctVariables,uVar8),(int)local_1b0,
                 (sockaddr *)(ulong)local_1c0.q,(socklen_t)local_1c0.t._content);
            goto LAB_0041bfc0;
          }
        }
        bVar1 = Kernel::TermList::isSpecialVar((TermList *)0x41c33b);
        if (bVar1) {
          local_1d0 = local_140._content;
          bVar1 = isBound(pIVar3,var);
          if (!bVar1) {
            local_1d8 = local_140._content;
            local_1f0 = local_148._content;
            TermSpec::TermSpec(&local_1e8,(bool)((byte)local_f8 & 1),local_148);
            bind((InstMatcher *)CONCAT17(disjunctVariables,uVar8),(int)local_1d8,
                 (sockaddr *)(ulong)local_1e8.q,(socklen_t)local_1e8.t._content);
            goto LAB_0041bfc0;
          }
        }
        local_208 = local_140._content;
        TermSpec::TermSpec(&local_200,(bool)((byte)local_e8 & 1),local_140);
        TermSpec::TermSpec(&local_218,(bool)((byte)local_f8 & 1),local_148);
        if ((local_149 & 1) != 0) {
          TVar5 = deref((InstMatcher *)
                        CONCAT17(bVar7,CONCAT16(in_stack_fffffffffffffd7e,
                                                CONCAT15(bVar6,CONCAT14(in_stack_fffffffffffffd7c,
                                                                        in_stack_fffffffffffffd78)))
                                ),in_stack_fffffffffffffd80);
          local_200.t = TVar5.t._content;
          local_200._1_7_ = uStack_22f;
          local_200.q = TVar5.q;
        }
        if ((local_14a & 1) != 0) {
          TVar5 = deref((InstMatcher *)
                        CONCAT17(bVar7,CONCAT16(in_stack_fffffffffffffd7e,
                                                CONCAT15(bVar6,CONCAT14(in_stack_fffffffffffffd7c,
                                                                        in_stack_fffffffffffffd78)))
                                ),in_stack_fffffffffffffd80);
          local_218.t = TVar5.t._content;
          local_218._1_7_ = uStack_247;
          local_218.q = TVar5.q;
        }
        std::
        make_pair<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::InstMatcher::TermSpec&,Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::InstMatcher::TermSpec&>
                  ((TermSpec *)var._content,(TermSpec *)pIVar3);
        var._content = in_stack_fffffffffffffd98._content;
        pIVar3 = in_stack_fffffffffffffd90;
        elem_00.first.t._content._0_4_ = in_stack_fffffffffffffd78;
        elem_00.first._0_8_ = local_258;
        elem_00.first.t._content._4_1_ = in_stack_fffffffffffffd7c;
        elem_00.first.t._content._5_1_ = bVar6;
        elem_00.first.t._content._6_1_ = in_stack_fffffffffffffd7e;
        elem_00.first.t._content._7_1_ = bVar7;
        elem_00.second._0_8_ = in_stack_fffffffffffffd80._content;
        elem_00.second.t._content._0_7_ = uVar8;
        elem_00.second.t._content._7_1_ = disjunctVariables;
        in_stack_fffffffffffffd90 = pIVar3;
        in_stack_fffffffffffffd98._content = var._content;
        Lib::
        Stack<std::pair<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::InstMatcher::TermSpec,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::InstMatcher::TermSpec>_>
        ::push((Stack<std::pair<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::InstMatcher::TermSpec,_Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::InstMatcher::TermSpec>_>
                *)var._content,elem_00);
        goto LAB_0041bfc0;
      }
      local_158 = local_140._content;
      bVar1 = isBound(pIVar3,var);
      if (bVar1) goto LAB_0041c1d4;
      local_160 = local_140._content;
      local_178 = local_148._content;
      TermSpec::TermSpec(&local_170,(bool)((byte)local_f8 & 1),local_148);
      bind((InstMatcher *)CONCAT17(disjunctVariables,uVar8),(int)local_160,
           (sockaddr *)(ulong)local_170.q,(socklen_t)local_170.t._content);
    } while( true );
  }
  local_a1 = true;
LAB_0041c52d:
  if ((local_a1 == false) && ((local_21 & 1) != 0)) {
    backtrack((InstMatcher *)in_stack_fffffffffffffd80._content);
  }
  return (bool)(local_a1 & 1);
}

Assistant:

bool SubstitutionTree<LeafData_>::InstMatcher::matchNextAux(TermList queryTerm, TermList nodeTerm, bool separate)
{
  unsigned specVar;
  TermSpec tsBinding;

  TermSpec tsNode(false, nodeTerm);

  if(queryTerm.isSpecialVar()){
    specVar = queryTerm.var();
    if(!findSpecVarBinding(specVar,tsBinding)) {
      bind(TermList(specVar,true), tsNode);
      return true;
    }
  } else {
    tsBinding = TermSpec(true, queryTerm);
  }

  if(tsBinding.q && tsBinding.t.isOrdinaryVar() && !isBound(tsBinding.t)) {
    bind(tsBinding.t, tsNode);
    return true;
  }

  bool success;

  if(nodeTerm.isTerm() && nodeTerm.term()->shared() && nodeTerm.term()->ground() &&
      tsBinding.q && tsBinding.t.isTerm() && tsBinding.t.term()->ground()) {
    success=nodeTerm.term()==tsBinding.t.term();
    goto finish;
  }

  static Stack<std::pair<TermSpec,TermSpec> > toDo;
  static DisagreementSetIterator dsit;

  toDo.reset();
  toDo.push(std::make_pair(tsBinding, tsNode));

  while(toDo.isNonEmpty()) {
    TermSpec ts1=toDo.top().first;
    TermSpec ts2=toDo.pop().second;
//    ASS(!ts2.q); //ts2 is always a node term

    dsit.reset(ts1.t, ts2.t, ts1.q!=ts2.q);
    while(dsit.hasNext()) {
      std::pair<TermList,TermList> disarg=dsit.next();
      TermList dt1=disarg.first;
      TermList dt2=disarg.second;

      bool dt1Bindable= !dt1.isTerm() && (ts1.q || !dt1.isOrdinaryVar());
      bool dt2Bindable= !dt2.isTerm() && (ts2.q || !dt2.isOrdinaryVar());

      if(!dt1Bindable && !dt2Bindable) {
	success=false;
	goto finish;
      }

      //we try to bind ordinary variables first, as binding a special
      //variable to an ordinary variable does not allow us to cut off
      //children when entering a node (a term to bind the special variable
      //may come later, so we want to keep it unbound)

      if(ts1.q && dt1.isOrdinaryVar() && !isBound(dt1)) {
	bind(dt1, TermSpec(ts2.q,dt2));
	continue;
      }
      if(ts2.q && dt2.isOrdinaryVar() && !isBound(dt2)) {
	bind(dt2, TermSpec(ts1.q,dt1));
	continue;
      }

      if(dt2.isSpecialVar() && !isBound(dt2)) {
	ASS(!ts2.q);
	bind(dt2, TermSpec(ts1.q,dt1));
	continue;
      }
      if(dt1.isSpecialVar() && !isBound(dt1)) {
	ASS(!ts1.q);
	bind(dt1, TermSpec(ts2.q,dt2));
	continue;
      }

      TermSpec deref1=TermSpec(ts1.q, dt1);
      TermSpec deref2=TermSpec(ts2.q, dt2);
      if(dt1Bindable) {
	ASS(isBound(dt1)); //if unbound, we would have assigned it earlier
	deref1=deref(dt1);
      }
      if(dt2Bindable) {
	ASS(isBound(dt2));
	deref2=deref(dt2);
      }

      toDo.push(std::make_pair(deref1, deref2));
    }
  }
  success=true;

finish:
  if(!success) {
    //if this matching was joined to the previous one, we don't
    //have to care about unbinding as caller will do this by calling
    //backtrack for the matching we're joined to.
    if(separate) {
      //we have to unbind variables, that were bound.
      backtrack();
    }
  }
  return success;
}